

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_bot.cpp
# Opt level: O0

void Cmd_freeze(FCommandLine *argv,APlayerPawn *who,int key)

{
  bool bVar1;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  bVar1 = CheckCheatmode(true);
  if (!bVar1) {
    if (((netgame & 1U) == 0) || (((&DAT_01ae7251)[(long)consoleplayer * 0x2a0] & 1) != 0)) {
      Net_WriteByte('\n');
      Net_WriteByte('%');
    }
    else {
      Printf("Only setting controllers can use freeze mode\n");
    }
  }
  return;
}

Assistant:

CCMD (freeze)
{
	if (CheckCheatmode ())
		return;

	if (netgame && !players[consoleplayer].settings_controller)
	{
		Printf ("Only setting controllers can use freeze mode\n");
		return;
	}

	Net_WriteByte (DEM_GENERICCHEAT);
	Net_WriteByte (CHT_FREEZE);
}